

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetImageWidget.cpp
# Opt level: O2

void __thiscall TargetImageWidget::LoadImage(TargetImageWidget *this,QString *fileName)

{
  long lVar1;
  char cVar2;
  int iVar3;
  QArrayDataPointer<char16_t> QStack_48;
  QArrayDataPointer<char16_t> local_30;
  
  cVar2 = QImage::load((QString *)&this->image_,(char *)fileName);
  if (cVar2 != '\0') {
    PanAndZoomWidget::ResetView(&this->super_PanAndZoomWidget);
    PanAndZoomWidget::ResetTranslation(&this->super_PanAndZoomWidget);
    onFitToTargetRequested(this);
    lVar1 = QImage::size();
    if (lVar1 == 0x100000001000) {
      QString::QString((QString *)&local_30,"Skip modification?");
      QString::QString((QString *)&QStack_48,
                       "This image is already 4096 * 4096 pixels, would you like to set this as the target image directly?"
                      );
      iVar3 = QMessageBox::question(this,&local_30,&QStack_48,0x14000,0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
      if (iVar3 == 0x4000) {
        onUseWholeImageRequested(this);
      }
    }
  }
  return;
}

Assistant:

void TargetImageWidget::LoadImage(QString fileName)
{
    if (image_.load(fileName)) {
        ResetView();
        onResetTranslationRequested();
        onFitToTargetRequested();

        if (image_.size() == QSize(4096, 4096)) {
            int response = QMessageBox::question(this, "Skip modification?", "This image is already 4096 * 4096 pixels, would you like to set this as the target image directly?");
            if (response == QMessageBox::StandardButton::Yes) {
                emit onUseWholeImageRequested();
            }
        }
    }
}